

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O1

utf8proc_ssize_t
utf8proc_decompose(utf8proc_uint8_t *str,utf8proc_ssize_t strlen,utf8proc_int32_t *buffer,
                  utf8proc_ssize_t bufsize,utf8proc_option_t options)

{
  uint uVar1;
  uint uVar2;
  utf8proc_ssize_t uVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  utf8proc_int32_t uc;
  int boundclass;
  uint local_48 [2];
  utf8proc_ssize_t local_40;
  long local_38;
  
  puVar4 = (uint *)0xfffffffffffffffb;
  if ((options & (UTF8PROC_STRIPMARK|UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != UTF8PROC_STRIPMARK &&
      (~options & 0x18) != 0) {
    puVar4 = local_48 + 1;
    local_48[1] = 0;
    lVar6 = 0;
    puVar7 = (uint *)0x0;
    local_40 = bufsize;
    local_38 = strlen;
    do {
      if ((options & UTF8PROC_NULLTERM) != 0) {
        uVar3 = utf8proc_iterate(str + lVar6,-1,(utf8proc_int32_t *)local_48);
        puVar4 = (uint *)(ulong)local_48[0];
        if ((int)local_48[0] < 0) {
LAB_00133f24:
          puVar4 = (uint *)0xfffffffffffffffd;
          goto LAB_00133f2b;
        }
        lVar6 = uVar3 + lVar6;
        if (-1 < lVar6) {
          if (local_48[0] != 0) goto LAB_00133edb;
LAB_00133f30:
          uVar3 = 1;
          goto LAB_00133f33;
        }
        break;
      }
      if (local_38 - lVar6 == 0 || local_38 < lVar6) goto LAB_00133f30;
      uVar3 = utf8proc_iterate(str + lVar6,local_38 - lVar6,(utf8proc_int32_t *)local_48);
      if ((int)local_48[0] < 0) goto LAB_00133f24;
      lVar6 = uVar3 + lVar6;
LAB_00133edb:
      uVar3 = 0;
      lVar5 = local_40 - (long)puVar7;
      if (local_40 - (long)puVar7 == 0 || local_40 < (long)puVar7) {
        lVar5 = uVar3;
      }
      puVar4 = (uint *)utf8proc_decompose_char
                                 (local_48[0],buffer + (long)puVar7,lVar5,options,
                                  (int *)(local_48 + 1));
      if ((long)puVar4 < 0) goto LAB_00133f33;
      puVar7 = (uint *)((long)puVar7 + (long)puVar4);
      puVar4 = (uint *)0x1000000000000000;
    } while ((long)puVar7 < 0x1000000000000000);
    puVar4 = (uint *)0xfffffffffffffffe;
LAB_00133f2b:
    uVar3 = 0;
LAB_00133f33:
    if (((((char)uVar3 != '\0') &&
         (puVar4 = puVar7, (options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != 0)) &&
        ((long)puVar7 <= local_40)) && (1 < (long)puVar7)) {
      lVar6 = 0;
      do {
        uVar1 = buffer[lVar6];
        uVar2 = buffer[lVar6 + 1];
        lVar5 = lVar6 + 1;
        if ((utf8proc_properties
             [utf8proc_stage2table[(uVar2 & 0xff) + (uint)utf8proc_stage1table[(int)uVar2 >> 8]]].
             combining_class <
             utf8proc_properties
             [utf8proc_stage2table[(uVar1 & 0xff) + (uint)utf8proc_stage1table[(int)uVar1 >> 8]]].
             combining_class) &&
           (0 < utf8proc_properties
                [utf8proc_stage2table[(uVar2 & 0xff) + (uint)utf8proc_stage1table[(int)uVar2 >> 8]]]
                .combining_class)) {
          buffer[lVar6] = uVar2;
          buffer[lVar6 + 1] = uVar1;
          if (0 < lVar6) {
            lVar5 = lVar6 + -1;
          }
        }
        lVar6 = lVar5;
      } while (lVar5 < (long)((long)puVar7 - 1U));
    }
  }
  return (utf8proc_ssize_t)puVar4;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose(
  const utf8proc_uint8_t *str, utf8proc_ssize_t strlen,
  utf8proc_int32_t *buffer, utf8proc_ssize_t bufsize, utf8proc_option_t options
) {
  /* strlen will be ignored, if UTF8PROC_NULLTERM is set in options */
  utf8proc_ssize_t wpos = 0;
  if ((options & UTF8PROC_COMPOSE) && (options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  if ((options & UTF8PROC_STRIPMARK) &&
      !(options & UTF8PROC_COMPOSE) && !(options & UTF8PROC_DECOMPOSE))
    return UTF8PROC_ERROR_INVALIDOPTS;
  {
    utf8proc_int32_t uc;
    utf8proc_ssize_t rpos = 0;
    utf8proc_ssize_t decomp_result;
    int boundclass = UTF8PROC_BOUNDCLASS_START;
    while (1) {
      if (options & UTF8PROC_NULLTERM) {
        rpos += utf8proc_iterate(str + rpos, -1, &uc);
        /* checking of return value is not necessary,
           as 'uc' is < 0 in case of error */
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
        if (rpos < 0) return UTF8PROC_ERROR_OVERFLOW;
        if (uc == 0) break;
      } else {
        if (rpos >= strlen) break;
        rpos += utf8proc_iterate(str + rpos, strlen - rpos, &uc);
        if (uc < 0) return UTF8PROC_ERROR_INVALIDUTF8;
      }
      decomp_result = utf8proc_decompose_char(
        uc, buffer + wpos, (bufsize > wpos) ? (bufsize - wpos) : 0, options,
        &boundclass
      );
      if (decomp_result < 0) return decomp_result;
      wpos += decomp_result;
      /* prohibiting integer overflows due to too long strings: */
      if (wpos < 0 ||
          wpos > (utf8proc_ssize_t)(SSIZE_MAX/sizeof(utf8proc_int32_t)/2))
        return UTF8PROC_ERROR_OVERFLOW;
    }
  }
  if ((options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) && bufsize >= wpos) {
    utf8proc_ssize_t pos = 0;
    while (pos < wpos-1) {
      utf8proc_int32_t uc1, uc2;
      const utf8proc_property_t *property1, *property2;
      uc1 = buffer[pos];
      uc2 = buffer[pos+1];
      property1 = unsafe_get_property(uc1);
      property2 = unsafe_get_property(uc2);
      if (property1->combining_class > property2->combining_class &&
          property2->combining_class > 0) {
        buffer[pos] = uc2;
        buffer[pos+1] = uc1;
        if (pos > 0) pos--; else pos++;
      } else {
        pos++;
      }
    }
  }
  return wpos;
}